

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.hpp
# Opt level: O0

void __thiscall
helics::EndpointInfo::EndpointInfo
          (EndpointInfo *this,GlobalHandle handle,string_view key_,string_view type_)

{
  pointer in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffff8c;
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  *this_00;
  allocator<char> local_45 [5];
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  (in_RDI->_M_dataplus)._M_p = in_RSI;
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  this_00 = (shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
             *)&in_RDI[1]._M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(local_45);
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::shared_guarded<>(this_00);
  std::atomic<int>::atomic((atomic<int> *)this_00,in_stack_ffffffffffffff8c);
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::vector
            ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *)
             0x51e2bd);
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::vector
            ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *)
             0x51e2ce);
  std::
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)0x51e2df);
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI);
  *(undefined1 *)&in_RDI[0xb]._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&in_RDI[0xb]._M_dataplus._M_p + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xb]._M_dataplus._M_p + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0xb]._M_dataplus._M_p + 3) = 0;
  *(undefined1 *)((long)&in_RDI[0xb]._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)&in_RDI[0xb]._M_string_length = 0;
  return;
}

Assistant:

EndpointInfo(GlobalHandle handle, std::string_view key_, std::string_view type_):
        id(handle), key(key_), type(type_)
    {
    }